

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  int num2;
  int num1;
  int local_20;
  int local_1c;
  
  printf("Enter a number: ");
  __isoc99_scanf("%i",&local_1c);
  printf("Enter a second number: ");
  __isoc99_scanf("%i",&local_20);
  uVar1 = min_value(local_1c,local_20);
  printf("The lesser of the two is: %i\n",(ulong)uVar1);
  return 0;
}

Assistant:

int main() {

    int num1, num2;

    printf("Enter a number: ");
    scanf("%i", &num1);
    
    printf("Enter a second number: ");
    scanf("%i", &num2);

    printf("The lesser of the two is: %i\n", min_value(num1, num2));

    /* 'a' is not accessible here */
    /* printf("%i", a); */

    return 0;
}